

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::insert
          (vector<crnlib::find_files::file_desc> *this,uint index,file_desc *p,uint n)

{
  file_desc *pfVar1;
  uint uVar2;
  file_desc *pfVar3;
  uint uVar4;
  file_desc *pfVar5;
  long lVar6;
  int iVar7;
  uint min_new_capacity;
  
  if (n != 0) {
    uVar2 = this->m_size;
    min_new_capacity = uVar2 + n;
    if (CARRY4(uVar2,n)) {
      pfVar3 = this->m_p + min_new_capacity;
      lVar6 = (ulong)-n * 0x48;
      do {
        find_files::file_desc::~file_desc(pfVar3);
        pfVar3 = pfVar3 + 1;
        lVar6 = lVar6 + -0x48;
      } while (lVar6 != 0);
      pfVar3 = this->m_p;
    }
    else {
      uVar4 = uVar2;
      if (this->m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,min_new_capacity,true,0x48,object_mover,false);
        uVar4 = this->m_size;
      }
      pfVar3 = this->m_p;
      if (min_new_capacity - uVar4 != 0) {
        pfVar5 = pfVar3 + uVar4;
        pfVar1 = pfVar5 + (min_new_capacity - uVar4);
        do {
          (pfVar5->m_fullname).m_buf_size = 0;
          (pfVar5->m_fullname).m_len = 0;
          (pfVar5->m_fullname).m_pStr = (char *)0x0;
          (pfVar5->m_base).m_buf_size = 0;
          (pfVar5->m_base).m_len = 0;
          (pfVar5->m_base).m_pStr = (char *)0x0;
          (pfVar5->m_rel).m_buf_size = 0;
          (pfVar5->m_rel).m_len = 0;
          (pfVar5->m_rel).m_pStr = (char *)0x0;
          (pfVar5->m_name).m_buf_size = 0;
          (pfVar5->m_name).m_len = 0;
          (pfVar5->m_name).m_pStr = (char *)0x0;
          pfVar5->m_is_dir = false;
          pfVar5 = pfVar5 + 1;
        } while (pfVar5 != pfVar1);
      }
    }
    this->m_size = min_new_capacity;
    iVar7 = uVar2 - index;
    if (iVar7 != 0) {
      pfVar3 = pfVar3 + uVar2;
      do {
        dynamic_string::set(&pfVar3[(ulong)n - 1].m_fullname,&pfVar3[-1].m_fullname,0xffffffff);
        dynamic_string::set(&pfVar3[(ulong)n - 1].m_base,&pfVar3[-1].m_base,0xffffffff);
        dynamic_string::set(&pfVar3[(ulong)n - 1].m_rel,&pfVar3[-1].m_rel,0xffffffff);
        dynamic_string::set(&pfVar3[(ulong)n - 1].m_name,&pfVar3[-1].m_name,0xffffffff);
        pfVar3[(ulong)n - 1].m_is_dir = pfVar3[-1].m_is_dir;
        iVar7 = iVar7 + -1;
        pfVar3 = pfVar3 + -1;
      } while (iVar7 != 0);
      pfVar3 = this->m_p;
    }
    pfVar3 = pfVar3 + index;
    do {
      dynamic_string::set(&pfVar3->m_fullname,&p->m_fullname,0xffffffff);
      dynamic_string::set(&pfVar3->m_base,&p->m_base,0xffffffff);
      dynamic_string::set(&pfVar3->m_rel,&p->m_rel,0xffffffff);
      dynamic_string::set(&pfVar3->m_name,&p->m_name,0xffffffff);
      pfVar3->m_is_dir = p->m_is_dir;
      pfVar3 = pfVar3 + 1;
      p = p + 1;
      n = n - 1;
    } while (n != 0);
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n)
        {
            CRNLIB_ASSERT(index <= m_size);
            if (!n)
            {
                return;
            }

            const uint orig_size = m_size;
            resize(m_size + n, true);

            const uint num_to_move = orig_size - index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
                memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            }
            else
            {
                const T* pSrc = m_p + orig_size - 1;
                T* pDst = const_cast<T*>(pSrc) + n;

                for (uint i = 0; i < num_to_move; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst-- = *pSrc--;
                }
            }

            T* pDst = m_p + index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
                memcpy(pDst, p, sizeof(T) * n);
            }
            else
            {
                for (uint i = 0; i < n; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst++ = *p++;
                }
            }
        }